

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O0

void __thiscall
license::FullLicenseInfo::FullLicenseInfo
          (FullLicenseInfo *this,string *source,string *product,string *license_signature,
          int licenseVersion,string *from_date,string *to_date,string *client_signature,
          uint from_sw_version,uint to_sw_version,string *extra_data)

{
  bool bVar1;
  long lVar2;
  bool local_99;
  string *from_date_local;
  int licenseVersion_local;
  string *license_signature_local;
  string *product_local;
  string *source_local;
  FullLicenseInfo *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)source);
  std::__cxx11::string::string((string *)&this->product,(string *)product);
  std::__cxx11::string::string((string *)&this->license_signature,(string *)license_signature);
  this->license_version = licenseVersion;
  std::__cxx11::string::string((string *)&this->from_date,(string *)from_date);
  std::__cxx11::string::string((string *)&this->to_date,(string *)to_date);
  bVar1 = std::operator!=(to_date,UNUSED_TIME);
  this->has_expiry = bVar1;
  this->from_sw_version = from_sw_version;
  this->to_sw_version = to_sw_version;
  local_99 = from_sw_version != 0 || to_sw_version != 0;
  this->has_versions = local_99;
  std::__cxx11::string::string((string *)&this->client_signature,(string *)client_signature);
  lVar2 = std::__cxx11::string::length();
  this->has_client_sig = lVar2 != 0;
  std::__cxx11::string::string((string *)&this->extra_data,(string *)extra_data);
  return;
}

Assistant:

FullLicenseInfo::FullLicenseInfo(const string& source, const string& product,
		const string& license_signature, int licenseVersion, string from_date,
		string to_date, const string& client_signature,
		unsigned int from_sw_version, unsigned int to_sw_version,
		const string& extra_data) :
		source(source), product(product), //
		license_signature(license_signature), license_version(licenseVersion), //
		from_date(from_date), to_date(to_date), //
		has_expiry(to_date != UNUSED_TIME), //
		from_sw_version(from_sw_version), to_sw_version(to_sw_version), //
		has_versions(
				from_sw_version != UNUSED_SOFTWARE_VERSION
						|| to_sw_version != UNUSED_SOFTWARE_VERSION), //
		client_signature(client_signature), has_client_sig(
				client_signature.length() > 0), //
		extra_data(extra_data) {
}